

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall
QTableWidgetPrivate::dataChanged
          (QTableWidgetPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  bool bVar1;
  int column;
  SortOrder order;
  QTableModel *this_00;
  
  if ((this->super_QTableViewPrivate).sortingEnabled == true) {
    bVar1 = QModelIndex::isValid(topLeft);
    if (bVar1) {
      bVar1 = QModelIndex::isValid(bottomRight);
      if (bVar1) {
        column = QHeaderView::sortIndicatorSection((this->super_QTableViewPrivate).horizontalHeader)
        ;
        if ((topLeft->c <= column) && (column <= bottomRight->c)) {
          order = QHeaderView::sortIndicatorOrder((this->super_QTableViewPrivate).horizontalHeader);
          this_00 = tableModel(this);
          QTableModel::ensureSorted(this_00,column,order,topLeft->r,bottomRight->r);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void QTableWidgetPrivate::dataChanged(const QModelIndex &topLeft,
                                      const QModelIndex &bottomRight)
{
    if (sortingEnabled && topLeft.isValid() && bottomRight.isValid()) {
        int column = horizontalHeader->sortIndicatorSection();
        if (column >= topLeft.column() && column <= bottomRight.column()) {
            Qt::SortOrder order = horizontalHeader->sortIndicatorOrder();
            tableModel()->ensureSorted(column, order, topLeft.row(), bottomRight.row());
        }
    }
}